

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O3

LY_ERR lys_parse_fd(ly_ctx *ctx,int fd,LYS_INFORMAT format,lys_module **module)

{
  LY_ERR LVar1;
  char *pcVar2;
  ly_in *in;
  ly_in *local_28;
  
  local_28 = (ly_in *)0x0;
  if (fd < 0) {
    pcVar2 = "fd > -1";
  }
  else {
    if (format != LYS_IN_UNKNOWN) {
      LVar1 = ly_in_new_fd(fd,&local_28);
      if (LVar1 != LY_SUCCESS) {
        ly_log(ctx,LY_LLERR,LVar1,"Unable to create input handler.");
        return LVar1;
      }
      LVar1 = lys_parse(ctx,local_28,format,(char **)0x0,module);
      ly_in_free(local_28,'\0');
      return LVar1;
    }
    pcVar2 = "format != LYS_IN_UNKNOWN";
  }
  ly_log(ctx,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar2,"lys_parse_fd");
  return LY_EINVAL;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lys_parse_fd(struct ly_ctx *ctx, int fd, LYS_INFORMAT format, struct lys_module **module)
{
    LY_ERR ret;
    struct ly_in *in = NULL;

    LY_CHECK_ARG_RET(ctx, fd > -1, format != LYS_IN_UNKNOWN, LY_EINVAL);

    LY_CHECK_ERR_RET(ret = ly_in_new_fd(fd, &in), LOGERR(ctx, ret, "Unable to create input handler."), ret);

    ret = lys_parse(ctx, in, format, NULL, module);
    ly_in_free(in, 0);

    return ret;
}